

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O2

string * __thiscall
HttpTestListener::GetRequestMethod_abi_cxx11_(string *__return_storage_ptr__,HttpTestListener *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->request_method_);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpTestListener::GetRequestMethod() {
  return this->request_method_;
}